

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O2

void __thiscall TCPServer::TCPServer(TCPServer *this,string *nm,SessionFactory *factory,int port)

{
  int iVar1;
  int iVar2;
  sockaddr local_58;
  socklen_t len;
  int yes;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)nm);
  Subscriber::Subscriber(&this->super_Subscriber,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_Subscriber)._vptr_Subscriber = (_func_int **)&PTR_on_error_00140c20;
  std::function<std::shared_ptr<Subscriber>_(Poll_&,_TCPServer_&,_sockaddr_in)>::function
            (&this->client_factory,factory);
  local_58.sa_data[6] = '\0';
  local_58.sa_data[7] = '\0';
  local_58.sa_data[8] = '\0';
  local_58.sa_data[9] = '\0';
  local_58.sa_data[10] = '\0';
  local_58.sa_data[0xb] = '\0';
  local_58.sa_data[0xc] = '\0';
  local_58.sa_data[0xd] = '\0';
  local_58.sa_family = 2;
  local_58.sa_data[2] = '\0';
  local_58.sa_data[3] = '\0';
  local_58.sa_data[4] = '\0';
  local_58.sa_data[5] = '\0';
  local_58.sa_data._0_2_ = (ushort)port << 8 | (ushort)port >> 8;
  iVar1 = socket(2,1,0);
  iVar1 = no_err(iVar1,"create socket");
  yes = 1;
  iVar2 = setsockopt(iVar1,1,2,&yes,4);
  no_err(iVar2,"setsockopt reuseaddr");
  iVar2 = bind(iVar1,&local_58,0x10);
  no_err(iVar2,"bind");
  iVar2 = listen(iVar1,5);
  no_err(iVar2,"listen");
  Subscriber::set_fd(&this->super_Subscriber,iVar1);
  Subscriber::set_expected(&this->super_Subscriber,1);
  len = 0x10;
  iVar1 = getsockname(iVar1,&local_58,&len);
  no_err(iVar1,"getsockname");
  this->port = (uint)(ushort)(local_58.sa_data._0_2_ << 8 | (ushort)local_58.sa_data._0_2_ >> 8);
  return;
}

Assistant:

TCPServer::TCPServer(std::string nm, TCPServer::SessionFactory factory, int port) :
    Subscriber(std::move(nm)),
    client_factory(std::move(factory)) {
  struct sockaddr_in server_address{};
  server_address.sin_family = AF_INET; // IPv4
  server_address.sin_addr.s_addr = htonl(INADDR_ANY); // listening on all interfaces
  server_address.sin_port = htons(port);
  int sock = no_err(socket(PF_INET, SOCK_STREAM, 0), "create socket"); // creating IPv4 TCP file_desc

  int yes = 1;
  no_err(setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, &yes, sizeof(int)), "setsockopt reuseaddr");
  no_err(bind(sock, (struct sockaddr *) &server_address, sizeof(server_address)), "bind");
  // switch to listening (passive open)
  no_err(listen(sock, 5), "listen");
  set_fd(sock);
  set_expected(POLLIN);
  socklen_t len = sizeof(server_address);
  no_err(getsockname(sock, (struct sockaddr *) &server_address, &len), "getsockname");
  this->port = ntohs(server_address.sin_port);
}